

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O1

void __thiscall
QTextDocumentLayoutPrivate::layoutFlow
          (QTextDocumentLayoutPrivate *this,Iterator it,QTextLayoutStruct *layoutStruct,
          int layoutFrom,int layoutTo,QFixed width)

{
  QRectF *pQVar1;
  QList<QCheckPoint> *pQVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  _func_int **pp_Var5;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  QTextFrame *pQVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  uint uVar19;
  int *piVar20;
  bool bVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  QFixed QVar27;
  QTextFrameLayoutData *data;
  long lVar28;
  QTextFrame *pQVar29;
  iterator iVar30;
  iterator iVar31;
  QTextLayout *pQVar32;
  QTextOption *pQVar33;
  QTextFrame *pQVar34;
  QTextFrameLayoutData *data_00;
  QTextFrameLayoutData *pQVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  QTextBlockFormat *previousBlockFormat;
  ulong uVar40;
  QTextDocumentLayoutPrivate *pQVar41;
  QCheckPoint *pQVar42;
  QTextDocumentLayoutPrivate *this_00;
  long in_FS_OFFSET;
  bool bVar43;
  double dVar44;
  qreal qVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QTextLine QVar48;
  QSizeF QVar49;
  QPointF QVar50;
  int local_194;
  ulong local_188;
  QString local_120;
  QTextFormat local_108;
  QRectF local_f8;
  undefined1 local_d8 [8];
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  QRectF local_b8;
  undefined1 local_98 [8];
  qreal qStack_90;
  undefined1 local_88 [16];
  iterator local_78;
  undefined1 local_58 [4];
  QFixed QStack_54;
  int iStack_50;
  QFixed QStack_4c;
  QFixed QStack_48;
  QFixed QStack_44;
  int iStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::lcLayout();
  if (((byte)QtPrivateLogging::lcLayout::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
      1) != 0) {
    local_58 = (undefined1  [4])0x2;
    QStack_54.val = 0;
    iStack_50 = 0;
    QStack_4c.val = 0;
    QStack_48.val = 0;
    QStack_44.val = 0;
    iStack_40 = (int)QtPrivateLogging::lcLayout::category.name;
    uStack_3c = (undefined4)((ulong)QtPrivateLogging::lcLayout::category.name >> 0x20);
    QMessageLogger::debug();
    qVar45 = local_b8.xp;
    QVar46.m_data = (storage_type *)0x10;
    QVar46.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar46);
    QTextStream::operator<<((QTextStream *)qVar45,(QString *)&local_78);
    if ((QArrayData *)local_78.f != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_78.f)->super_QTextObject)->_q_value).super___atomic_base<int>.
      _M_i = (((QBasicAtomicInt *)&(local_78.f)->super_QTextObject)->_q_value).
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_78.f)->super_QTextObject)->_q_value).super___atomic_base<int>
          ._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78.f,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_b8.xp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8.xp,' ');
    }
    QTextStream::operator<<((QTextStream *)local_b8.xp,layoutFrom);
    if (*(QTextStream *)((long)local_b8.xp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8.xp,' ');
    }
    qVar45 = local_b8.xp;
    QVar47.m_data = (storage_type *)0x3;
    QVar47.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar47);
    QTextStream::operator<<((QTextStream *)qVar45,(QString *)&local_78);
    if ((QArrayData *)local_78.f != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_78.f)->super_QTextObject)->_q_value).super___atomic_base<int>.
      _M_i = (((QBasicAtomicInt *)&(local_78.f)->super_QTextObject)->_q_value).
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_78.f)->super_QTextObject)->_q_value).super___atomic_base<int>
          ._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78.f,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_b8.xp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8.xp,' ');
    }
    QTextStream::operator<<((QTextStream *)local_b8.xp,layoutTo);
    if (*(QTextStream *)((long)local_b8.xp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8.xp,' ');
    }
    QDebug::~QDebug((QDebug *)&local_b8);
  }
  pQVar15 = layoutStruct->frame;
  data = QTextFrame::layoutData(pQVar15);
  if (data == (QTextFrameLayoutData *)0x0) {
    lVar28 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
    if (lVar28 == 0) {
      data = (QTextFrameLayoutData *)operator_new(0x78);
      data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007edfd0;
      data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
      data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
      data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
    }
    else {
      data = (QTextFrameLayoutData *)operator_new(0x160);
      data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
      data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
      data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007ee180;
      data[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      memset(data + 0x11,0,0xc0);
    }
    QTextFrame::setLayoutData(pQVar15,data);
  }
  pQVar15 = it.f;
  data[10]._vptr_QTextFrameLayoutData = (_func_int **)layoutStruct;
  local_78._28_4_ = 0xaaaaaaaa;
  local_78.f = (QTextFrame *)0x0;
  local_78.b = 0;
  local_78.e = 0;
  local_78.cf._0_4_ = 0;
  local_78.cf._4_4_ = 0;
  local_78.cb = 0;
  pQVar29 = QTextDocument::rootFrame((this->super_QAbstractTextDocumentLayoutPrivate).document);
  if (pQVar15 == pQVar29) {
    bVar43 = true;
    if (layoutStruct->fullLayout == false) {
      bVar43 = (this->checkPoints).d.size == 0;
    }
    if (!bVar43) {
      pQVar2 = &this->checkPoints;
      iVar30 = QList<QCheckPoint>::begin(pQVar2);
      iVar31 = QList<QCheckPoint>::end(pQVar2);
      if (0 < (long)iVar31.i - (long)iVar30.i) {
        uVar40 = ((ulong)((long)iVar31.i - (long)iVar30.i) >> 3) * -0x5555555555555555;
        do {
          uVar37 = uVar40 >> 1;
          uVar38 = uVar37;
          if (iVar30.i[uVar37].positionInFrame < layoutFrom) {
            uVar38 = ~uVar37 + uVar40;
            iVar30.i = iVar30.i + uVar37 + 1;
          }
          uVar40 = uVar38;
        } while (0 < (long)uVar38);
      }
      iVar31 = QList<QCheckPoint>::end(pQVar2);
      if (iVar30.i != iVar31.i) {
        iVar31 = QList<QCheckPoint>::begin(pQVar2);
        pQVar42 = iVar30.i + -1;
        if (iVar30.i == iVar31.i) {
          pQVar42 = iVar30.i;
        }
        iVar22 = (pQVar42->y).val;
        (layoutStruct->y).val = iVar22;
        iVar23 = (pQVar42->frameY).val;
        (layoutStruct->frameY).val = iVar23;
        (layoutStruct->minimumWidth).val = (pQVar42->minimumWidth).val;
        (layoutStruct->maximumWidth).val = (pQVar42->maximumWidth).val;
        (layoutStruct->contentsWidth).val = (pQVar42->contentsWidth).val;
        uVar24 = (layoutStruct->pageHeight).val;
        uVar40 = (ulong)(int)uVar24;
        if (0 < (long)uVar40) {
          uVar36 = iVar23 + iVar22;
          uVar39 = -uVar36;
          if (0 < (int)uVar36) {
            uVar39 = uVar36;
          }
          iVar23 = (int)(((uVar40 >> 1) + (ulong)uVar39 * 0x40) / uVar40);
          iVar22 = -iVar23;
          if (-1 < (int)(uVar36 ^ uVar24)) {
            iVar22 = iVar23;
          }
          (layoutStruct->pageBottom).val =
               ((iVar22 >> 6) + 1) * uVar24 - (layoutStruct->pageBottomMargin).val;
        }
        frameIteratorForTextPosition((Iterator *)local_58,this,pQVar42->positionInFrame);
        it.f = (QTextFrame *)CONCAT44(QStack_54.val,local_58);
        it.cf._0_4_ = QStack_48.val;
        it.cf._4_4_ = QStack_44.val;
        it.cb = iStack_40;
        it.b = iStack_50;
        it.e = QStack_4c.val;
        iVar30 = QList<QCheckPoint>::begin(pQVar2);
        QList<QCheckPoint>::resize
                  (pQVar2,((long)pQVar42 - (long)iVar30.i >> 3) * -0x5555555555555555 + 1);
        iVar30 = QList<QCheckPoint>::begin(pQVar2);
        if (pQVar42 != iVar30.i) {
          local_78.cf._0_4_ = (int)it.cf;
          local_78.cf._4_4_ = it.cf._4_4_;
          local_78.cb = it.cb;
          local_78.f = it.f;
          local_78.b = it.b;
          local_78.e = it.e;
          QTextFrame::iterator::operator--(&local_78);
        }
        goto LAB_004f314b;
      }
    }
    pQVar2 = &this->checkPoints;
    QList<QCheckPoint>::clear(pQVar2);
    iStack_50 = 0;
    uVar3 = layoutStruct->frameY;
    uVar6 = layoutStruct->y;
    uVar12 = layoutStruct->minimumWidth;
    uVar16 = layoutStruct->maximumWidth;
    QStack_44.val = (layoutStruct->contentsWidth).val;
    local_58 = (undefined1  [4])uVar6;
    QStack_54.val = uVar3;
    QStack_4c.val = uVar12;
    QStack_48.val = uVar16;
    QtPrivate::QPodArrayOps<QCheckPoint>::emplace<QCheckPoint_const&>
              ((QPodArrayOps<QCheckPoint> *)pQVar2,(this->checkPoints).d.size,
               (QCheckPoint *)local_58);
    QList<QCheckPoint>::end(pQVar2);
  }
LAB_004f314b:
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextFrame::iterator::currentBlock(&local_78);
  QTextBlock::blockFormat((QTextBlock *)local_88);
  this_00 = (QTextDocumentLayoutPrivate *)CONCAT44(it.cf._4_4_,(int)it.cf);
  bVar43 = this_00 == (QTextDocumentLayoutPrivate *)0x0;
  if ((!bVar43) || (local_194 = 0, it.cb != it.e)) {
    pQVar1 = &layoutStruct->updateRectForFloats;
    local_194 = 0;
    do {
      if (0x1fffffbf < (layoutStruct->frameY).val + (layoutStruct->y).val) break;
      if (bVar43) {
        pQVar41 = (QTextDocumentLayoutPrivate *)local_58;
        QTextFrame::iterator::currentBlock(&it);
        iVar22 = QTextBlock::position((QTextBlock *)pQVar41);
      }
      else {
        pQVar41 = this_00;
        iVar22 = QTextFrame::firstPosition((QTextFrame *)this_00);
      }
      if (pQVar15 == pQVar29) {
        QVar27.val = (layoutStruct->y).val;
        uVar39 = QVar27.val - (this->checkPoints).d.ptr[(this->checkPoints).d.size + -1].y.val;
        uVar24 = -uVar39;
        if (0 < (int)uVar39) {
          uVar24 = uVar39;
        }
        if (0x1f400 < uVar24) {
          local_b8.xp = (qreal)((ulong)local_b8.xp & 0xffffffff00000000);
          local_d8 = (undefined1  [8])((ulong)local_d8 & 0xffffffff00000000);
          floatMargins(pQVar41,QVar27,layoutStruct,(QFixed *)&local_b8,(QFixed *)local_d8);
          if ((local_b8.xp._0_4_ == (layoutStruct->x_left).val) &&
             (local_d8._0_4_ == (layoutStruct->x_right).val)) {
            uVar4 = layoutStruct->frameY;
            uVar7 = layoutStruct->y;
            uVar13 = layoutStruct->minimumWidth;
            uVar17 = layoutStruct->maximumWidth;
            QStack_44.val = (layoutStruct->contentsWidth).val;
            local_58 = (undefined1  [4])uVar7;
            QStack_54.val = uVar4;
            iStack_50 = iVar22;
            QStack_4c.val = uVar13;
            QStack_48.val = uVar17;
            QtPrivate::QPodArrayOps<QCheckPoint>::emplace<QCheckPoint_const&>
                      ((QPodArrayOps<QCheckPoint> *)&this->checkPoints,(this->checkPoints).d.size,
                       (QCheckPoint *)local_58);
            QList<QCheckPoint>::end(&this->checkPoints);
            if ((this->currentLazyLayoutPosition == -1) ||
               (iVar22 <= this->currentLazyLayoutPosition + this->lazyLayoutStepSize)) {
              iVar23 = 0;
              bVar21 = true;
            }
            else {
              iVar23 = 6;
              bVar21 = false;
            }
            if (bVar21) goto LAB_004f3362;
          }
          else {
LAB_004f3362:
            iVar23 = 0;
          }
          if (iVar23 != 0) break;
        }
      }
      if (bVar43) {
        uStack_3c = 0xaaaaaaaa;
        local_58 = (undefined1  [4])0x0;
        QStack_54.val = 0;
        iStack_50 = 0;
        QStack_4c.val = 0;
        QStack_48.val = 0;
        QStack_44.val = 0;
        iStack_40 = 0;
        if (((CONCAT44(local_78.cf._4_4_,(int)local_78.cf) != 0) || (local_78.cb != local_78.e)) &&
           ((local_78.f != it.f ||
            ((CONCAT44(local_78.cf._4_4_,(int)local_78.cf) != CONCAT44(it.cf._4_4_,(int)it.cf) ||
             (local_78.cb != it.cb)))))) {
          QStack_48.val = (int)local_78.cf;
          QStack_44.val = local_78.cf._4_4_;
          iStack_40 = local_78.cb;
          local_58 = SUB84(local_78.f,0);
          QStack_54.val = (int)((ulong)local_78.f >> 0x20);
          iStack_50 = local_78.b;
          QStack_4c.val = local_78.e;
        }
        local_78.cf._0_4_ = (int)it.cf;
        local_78.cf._4_4_ = it.cf._4_4_;
        local_78.cb = it.cb;
        local_78.f = it.f;
        local_78.b = it.b;
        local_78.e = it.e;
        local_d8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        dStack_d0 = (double)&DAT_aaaaaaaaaaaaaaaa;
        QTextFrame::iterator::currentBlock(&it);
        QTextFrame::iterator::operator++(&it);
        local_f8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QTextBlock::blockFormat((QTextBlock *)&local_f8);
        uVar24 = QTextFormat::intProperty((QTextFormat *)&local_f8,0x7000);
        if (((uVar24 & 1) != 0) && (iVar23 = (layoutStruct->pageHeight).val, iVar23 != 0x1fffffc0))
        {
          iVar8 = (layoutStruct->y).val;
          iVar9 = (layoutStruct->pageBottom).val;
          (layoutStruct->pageBottom).val = iVar23 + iVar9;
          iVar23 = (iVar9 + (layoutStruct->pageBottomMargin).val + (layoutStruct->pageTopMargin).val
                   ) - (layoutStruct->frameY).val;
          if (iVar23 < iVar8) {
            iVar23 = iVar8;
          }
          (layoutStruct->y).val = iVar23;
        }
        iVar23 = (layoutStruct->pageBottom).val;
        iVar8 = (layoutStruct->y).val;
        iVar9 = (layoutStruct->maximumWidth).val;
        (layoutStruct->maximumWidth).val = 0;
        QTextFrame::iterator::currentBlock((iterator *)local_58);
        bVar43 = QTextBlock::isValid((QTextBlock *)&local_b8);
        previousBlockFormat = (QTextBlockFormat *)0x0;
        if (bVar43) {
          previousBlockFormat = (QTextBlockFormat *)local_88;
        }
        layoutBlock(this,(QTextBlock *)local_d8,iVar22,(QTextBlockFormat *)&local_f8,layoutStruct,
                    layoutFrom,layoutTo,previousBlockFormat);
        if (pQVar15 == pQVar29) {
          pQVar32 = QTextBlock::layout((QTextBlock *)local_d8);
          pQVar33 = QTextLayout::textOption(pQVar32);
          if ((undefined1  [24])((undefined1  [24])*pQVar33 & (undefined1  [24])0x1) ==
              (undefined1  [24])0x0) {
            this->contentHasAlignment = true;
          }
        }
        if ((((CONCAT44(it.cf._4_4_,(int)it.cf) == 0) && (it.cb == it.e)) ||
            (lVar28 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject), lVar28 == 0)) ||
           (((bVar43 = QTextBlock::isValid((QTextBlock *)local_d8), !bVar43 ||
             (iVar25 = QTextBlock::length((QTextBlock *)local_d8), iVar25 != 1)) ||
            ((bVar43 = QTextFormat::hasProperty((QTextFormat *)&local_f8,0x1060), bVar43 ||
             (bVar43 = QTextFormat::hasProperty((QTextFormat *)&local_f8,0x820), bVar43)))))) {
LAB_004f376a:
          pQVar34 = (QTextFrame *)CONCAT44(QStack_44.val,QStack_48.val);
          lVar28 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
          if (((lVar28 != 0) && (bVar43 = QTextBlock::isValid((QTextBlock *)local_d8), bVar43)) &&
             (iVar25 = QTextBlock::length((QTextBlock *)local_d8), iVar25 == 1)) {
            iVar25 = QTextFrame::lastPosition(pQVar34);
            iVar26 = QTextBlock::position((QTextBlock *)local_d8);
            if (iVar25 == iVar26 + -1) {
              pQVar34 = (QTextFrame *)CONCAT44(QStack_44.val,QStack_48.val);
              pQVar35 = QTextFrame::layoutData(pQVar34);
              if (pQVar35 == (QTextFrameLayoutData *)0x0) {
                lVar28 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
                if (lVar28 == 0) {
                  pQVar35 = (QTextFrameLayoutData *)operator_new(0x78);
                  pQVar35->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007edfd0;
                  *(undefined1 (*) [16])(pQVar35 + 1) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar35 + 3) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar35 + 5) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar35 + 7) = (undefined1  [16])0x0;
                  *(undefined4 *)&pQVar35[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
                  pQVar35[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  *(undefined2 *)&pQVar35[0xb]._vptr_QTextFrameLayoutData = 0x101;
                  *(undefined1 (*) [16])(pQVar35 + 0xc) = (undefined1  [16])0x0;
                  pQVar35[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                }
                else {
                  pQVar35 = (QTextFrameLayoutData *)operator_new(0x160);
                  *(undefined1 (*) [16])(pQVar35 + 1) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar35 + 3) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar35 + 5) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar35 + 7) = (undefined1  [16])0x0;
                  *(undefined4 *)&pQVar35[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
                  pQVar35[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  *(undefined2 *)&pQVar35[0xb]._vptr_QTextFrameLayoutData = 0x101;
                  *(undefined1 (*) [16])(pQVar35 + 0xc) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar35 + 0xe) = (undefined1  [16])0x0;
                  pQVar35->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007ee180;
                  *(undefined1 (*) [16])(pQVar35 + 0x2a) = (undefined1  [16])0x0;
                  memset(pQVar35 + 0x11,0,0xc0);
                }
                QTextFrame::setLayoutData(pQVar34,pQVar35);
              }
              pQVar32 = QTextBlock::layout((QTextBlock *)local_d8);
              local_98 = (undefined1  [8])0xffffffffffffffff;
              qStack_90 = -NAN;
              iVar25 = *(int *)&pQVar35[1]._vptr_QTextFrameLayoutData;
              iVar26 = *(int *)((long)&pQVar35[1]._vptr_QTextFrameLayoutData + 4);
              iVar10 = *(int *)&pQVar35[2]._vptr_QTextFrameLayoutData;
              iVar11 = *(int *)((long)&pQVar35[2]._vptr_QTextFrameLayoutData + 4);
              QTextLayout::boundingRect(&local_b8,pQVar32);
              qStack_90 = (double)(iVar26 + iVar11) * 0.015625 - local_b8.h;
              local_98 = (undefined1  [8])((double)(iVar25 + iVar10) * 0.015625);
              QTextLayout::setPosition(pQVar32,(QPointF *)local_98);
              (layoutStruct->y).val = iVar8;
              (layoutStruct->pageBottom).val = iVar23;
            }
          }
          pQVar34 = (QTextFrame *)CONCAT44(QStack_44.val,QStack_48.val);
          lVar28 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
          if (((lVar28 == 0) || (bVar43 = QTextBlock::isValid((QTextBlock *)local_d8), !bVar43)) ||
             (iVar25 = QTextBlock::length((QTextBlock *)local_d8), iVar25 < 2)) {
            bVar43 = false;
LAB_004f4293:
            bVar21 = bVar43;
            bVar43 = false;
          }
          else {
            QTextBlock::text(&local_120,(QTextBlock *)local_d8);
            bVar21 = true;
            bVar43 = true;
            if (*local_120.d.ptr != L'\x2028') goto LAB_004f4293;
            iVar25 = QTextFrame::lastPosition(pQVar34);
            iVar26 = QTextBlock::position((QTextBlock *)local_d8);
            bVar43 = iVar25 == iVar26 + -1;
          }
          if ((bVar21) && (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0)) {
            LOCK();
            ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (bVar43) {
            pQVar34 = (QTextFrame *)CONCAT44(QStack_44.val,QStack_48.val);
            pQVar35 = QTextFrame::layoutData(pQVar34);
            if (pQVar35 == (QTextFrameLayoutData *)0x0) {
              lVar28 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
              if (lVar28 == 0) {
                pQVar35 = (QTextFrameLayoutData *)operator_new(0x78);
                pQVar35->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007edfd0;
                *(undefined1 (*) [16])(pQVar35 + 1) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(pQVar35 + 3) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(pQVar35 + 5) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(pQVar35 + 7) = (undefined1  [16])0x0;
                *(undefined4 *)&pQVar35[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
                pQVar35[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                *(undefined2 *)&pQVar35[0xb]._vptr_QTextFrameLayoutData = 0x101;
                *(undefined1 (*) [16])(pQVar35 + 0xc) = (undefined1  [16])0x0;
                pQVar35[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              }
              else {
                pQVar35 = (QTextFrameLayoutData *)operator_new(0x160);
                *(undefined1 (*) [16])(pQVar35 + 1) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(pQVar35 + 3) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(pQVar35 + 5) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(pQVar35 + 7) = (undefined1  [16])0x0;
                *(undefined4 *)&pQVar35[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
                pQVar35[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                *(undefined2 *)&pQVar35[0xb]._vptr_QTextFrameLayoutData = 0x101;
                *(undefined1 (*) [16])(pQVar35 + 0xc) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(pQVar35 + 0xe) = (undefined1  [16])0x0;
                pQVar35->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007ee180;
                *(undefined1 (*) [16])(pQVar35 + 0x2a) = (undefined1  [16])0x0;
                memset(pQVar35 + 0x11,0,0xc0);
              }
              QTextFrame::setLayoutData(pQVar34,pQVar35);
            }
            pQVar32 = QTextBlock::layout((QTextBlock *)local_d8);
            iVar25 = QTextLayout::lineCount(pQVar32);
            if (iVar25 < 1) {
              iVar25 = 0;
            }
            else {
              QVar48 = QTextLayout::lineAt(pQVar32,0);
              local_b8.yp = (qreal)QVar48.eng;
              local_b8.xp = (qreal)CONCAT44(local_b8.xp._4_4_,QVar48.index);
              qVar45 = QTextLine::height((QTextLine *)&local_b8);
              iVar25 = (int)(qVar45 * 64.0);
            }
            if ((layoutStruct->pageBottom).val == iVar23) {
              (layoutStruct->y).val = (layoutStruct->y).val - iVar25;
              QVar50 = QTextLayout::position(pQVar32);
              local_b8.xp = QVar50.xp;
              local_b8.yp = (double)iVar25 * -0.015625 + QVar50.yp;
              QTextLayout::setPosition(pQVar32,(QPointF *)&local_b8);
            }
            else {
              (layoutStruct->y).val = iVar8 - iVar25;
              (layoutStruct->pageBottom).val = iVar23;
              layoutBlock(this,(QTextBlock *)local_d8,iVar22,(QTextBlockFormat *)&local_f8,
                          layoutStruct,layoutFrom,layoutTo,previousBlockFormat);
            }
            iVar22 = QTextLayout::lineCount(pQVar32);
            if (0 < iVar22) {
              iVar22 = *(int *)((long)&pQVar35[2]._vptr_QTextFrameLayoutData + 4);
              pp_Var5 = pQVar35[1]._vptr_QTextFrameLayoutData;
              iVar23 = *(int *)&pQVar35[2]._vptr_QTextFrameLayoutData;
              QVar48 = QTextLayout::lineAt(pQVar32,0);
              local_b8.yp = (qreal)QVar48.eng;
              local_b8.xp = (qreal)CONCAT44(local_b8.xp._4_4_,QVar48.index);
              QVar50 = QTextLayout::position(pQVar32);
              local_98 = (undefined1  [8])((double)(iVar23 + (int)pp_Var5) * 0.015625 - QVar50.xp);
              qStack_90 = (double)((iVar22 - iVar25) + (int)((ulong)pp_Var5 >> 0x20)) * 0.015625 -
                          QVar50.yp;
              QTextLine::setPosition((QTextLine *)&local_b8,(QPointF *)local_98);
            }
          }
          uVar24 = QTextFormat::intProperty((QTextFormat *)&local_f8,0x7000);
          if (((uVar24 & 0x10) != 0) &&
             (iVar22 = (layoutStruct->pageHeight).val, iVar22 != 0x1fffffc0)) {
            iVar23 = (layoutStruct->y).val;
            iVar8 = (layoutStruct->pageBottom).val;
            (layoutStruct->pageBottom).val = iVar22 + iVar8;
            iVar22 = (iVar8 + (layoutStruct->pageBottomMargin).val +
                     (layoutStruct->pageTopMargin).val) - (layoutStruct->frameY).val;
            if (iVar22 < iVar23) {
              iVar22 = iVar23;
            }
            (layoutStruct->y).val = iVar22;
          }
        }
        else {
          iVar25 = QTextFrame::firstPosition((QTextFrame *)CONCAT44(it.cf._4_4_,(int)it.cf));
          iVar26 = QTextBlock::position((QTextBlock *)local_d8);
          if (iVar25 != iVar26 + 1) goto LAB_004f376a;
          local_b8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_b8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          QTextFrame::iterator::currentBlock((iterator *)local_58);
          bVar43 = QTextBlock::isValid((QTextBlock *)&local_b8);
          dVar44 = 0.0;
          if (bVar43) {
            QTextBlock::blockFormat((QTextBlock *)&local_108);
            dVar44 = QTextFormat::doubleProperty(&local_108,0x1031);
            QTextFormat::~QTextFormat(&local_108);
          }
          QTextBlock::blockFormat((QTextBlock *)local_98);
          qVar45 = QTextFormat::doubleProperty((QTextFormat *)local_98,0x1030);
          if (qVar45 <= dVar44) {
            qVar45 = dVar44;
          }
          (layoutStruct->y).val = iVar8 + (int)(qVar45 * 64.0);
          QTextFormat::~QTextFormat((QTextFormat *)local_98);
          (layoutStruct->pageBottom).val = iVar23;
        }
        iVar22 = (layoutStruct->maximumWidth).val;
        if (local_194 <= iVar22) {
          local_194 = iVar22;
        }
        (layoutStruct->maximumWidth).val = iVar9;
        QTextFormat::operator=((QTextFormat *)local_88,(QTextFormat *)&local_f8);
        QTextFormat::~QTextFormat((QTextFormat *)&local_f8);
      }
      else {
        pQVar35 = QTextFrame::layoutData((QTextFrame *)this_00);
        pQVar41 = (QTextDocumentLayoutPrivate *)local_98;
        if (pQVar35 == (QTextFrameLayoutData *)0x0) {
          lVar28 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
          if (lVar28 == 0) {
            pQVar35 = (QTextFrameLayoutData *)operator_new(0x78);
            pQVar35->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007edfd0;
            *(undefined1 (*) [16])(pQVar35 + 1) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar35 + 3) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar35 + 5) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar35 + 7) = (undefined1  [16])0x0;
            *(undefined4 *)&pQVar35[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
            pQVar35[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined2 *)&pQVar35[0xb]._vptr_QTextFrameLayoutData = 0x101;
            *(undefined1 (*) [16])(pQVar35 + 0xc) = (undefined1  [16])0x0;
            pQVar35[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          }
          else {
            pQVar35 = (QTextFrameLayoutData *)operator_new(0x160);
            *(undefined1 (*) [16])(pQVar35 + 1) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar35 + 3) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar35 + 5) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar35 + 7) = (undefined1  [16])0x0;
            *(undefined4 *)&pQVar35[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
            pQVar35[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined2 *)&pQVar35[0xb]._vptr_QTextFrameLayoutData = 0x101;
            *(undefined1 (*) [16])(pQVar35 + 0xc) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar35 + 0xe) = (undefined1  [16])0x0;
            pQVar35->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007ee180;
            *(undefined1 (*) [16])(pQVar35 + 0x2a) = (undefined1  [16])0x0;
            memset(pQVar35 + 0x11,0,0xc0);
          }
          QTextFrame::setLayoutData((QTextFrame *)this_00,pQVar35);
        }
        local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        qStack_90 = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QTextFrame::frameFormat((QTextFrame *)pQVar41);
        iVar22 = QTextFormat::intProperty((QTextFormat *)pQVar41,0x800);
        if (iVar22 == 0) {
          uVar24 = QTextFormat::intProperty((QTextFormat *)pQVar41,0x7000);
          if (((uVar24 & 1) != 0) && (iVar22 = (layoutStruct->pageHeight).val, iVar22 != 0x1fffffc0)
             ) {
            iVar23 = (layoutStruct->y).val;
            iVar8 = (layoutStruct->pageBottom).val;
            (layoutStruct->pageBottom).val = iVar22 + iVar8;
            iVar22 = (iVar8 + (layoutStruct->pageBottomMargin).val +
                     (layoutStruct->pageTopMargin).val) - (layoutStruct->frameY).val;
            if (iVar22 < iVar23) {
              iVar22 = iVar23;
            }
            (layoutStruct->y).val = iVar22;
          }
          local_b8.xp = (qreal)((ulong)local_b8.xp & 0xffffffff00000000);
          local_d8 = (undefined1  [8])((ulong)local_d8 & 0xffffffff00000000);
          floatMargins(pQVar41,(QFixed)(layoutStruct->y).val,layoutStruct,(QFixed *)&local_b8,
                       (QFixed *)local_d8);
          iVar22 = (layoutStruct->x_left).val;
          if (iVar22 < local_b8.xp._0_4_) {
            iVar22 = local_b8.xp._0_4_;
          }
          local_b8.xp = (qreal)CONCAT44(local_b8.xp._4_4_,iVar22);
          iVar23 = (layoutStruct->x_right).val;
          if ((int)local_d8._0_4_ < iVar23) {
            iVar23 = local_d8._0_4_;
          }
          local_d8._0_4_ = iVar23;
          if (iVar23 - iVar22 < *(int *)&pQVar35[2]._vptr_QTextFrameLayoutData) {
            QVar27 = findY(pQVar41,(layoutStruct->y).val,layoutStruct,
                           *(int *)&pQVar35[2]._vptr_QTextFrameLayoutData);
            (layoutStruct->y).val = QVar27.val;
            floatMargins(pQVar41,QVar27,layoutStruct,(QFixed *)&local_b8,(QFixed *)local_d8);
          }
          qVar45 = local_b8.xp;
          uVar40 = (ulong)local_b8.xp & 0xffffffff;
          uVar24 = (layoutStruct->y).val;
          uVar38 = (ulong)uVar24;
          pQVar34 = (QTextFrame *)QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
          if (pQVar34 == (QTextFrame *)0x0) {
            uVar39 = 1;
          }
          else {
            QTextTable::format((QTextTable *)local_58);
            uVar39 = QTextFormat::intProperty((QTextFormat *)local_58,0x1010);
            QTextFormat::~QTextFormat((QTextFormat *)local_58);
          }
          if ((uVar39 & 1) == 0 && pQVar15 == pQVar29) {
            this->contentHasAlignment = true;
          }
          pQVar35[1]._vptr_QTextFrameLayoutData = (_func_int **)((uVar38 << 0x20) + uVar40);
          QVar49 = QTextDocument::pageSize
                             ((this->super_QAbstractTextDocumentLayoutPrivate).document);
          if (0.0 < QVar49.ht) {
            *(undefined1 *)&pQVar35[0xb]._vptr_QTextFrameLayoutData = 1;
          }
          if (*(char *)&pQVar35[0xb]._vptr_QTextFrameLayoutData == '\x01') {
            QVar27.val = (layoutStruct->frameY).val;
            if (width.val == 0) {
              layoutFrame((QRectF *)local_58,this,(QTextFrame *)this_00,layoutFrom,layoutTo,QVar27);
            }
            else {
              layoutFrame((QRectF *)local_58,this,(QTextFrame *)this_00,layoutFrom,layoutTo,width,
                          (QFixed)0xffffffc0,QVar27);
            }
            if (pQVar34 == (QTextFrame *)0x0) {
              QTextFrame::begin((iterator *)local_58,(QTextFrame *)this_00);
              QVar27 = flowPosition((iterator *)local_58);
            }
            else {
              data_00 = QTextFrame::layoutData(pQVar34);
              if (data_00 == (QTextFrameLayoutData *)0x0) {
                lVar28 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
                if (lVar28 == 0) {
                  data_00 = (QTextFrameLayoutData *)operator_new(0x78);
                  data_00->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007edfd0;
                  data_00[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  *(undefined4 *)&data_00[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
                  data_00[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  *(undefined2 *)&data_00[0xb]._vptr_QTextFrameLayoutData = 0x101;
                  data_00[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                }
                else {
                  data_00 = (QTextFrameLayoutData *)operator_new(0x160);
                  data_00[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  *(undefined4 *)&data_00[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
                  data_00[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  *(undefined2 *)&data_00[0xb]._vptr_QTextFrameLayoutData = 0x101;
                  data_00[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007ee180;
                  data_00[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  memset(data_00 + 0x11,0,0xc0);
                }
                QTextFrame::setLayoutData(pQVar34,data_00);
              }
              QVar27.val = *(int *)data_00[0x21]._vptr_QTextFrameLayoutData;
            }
            iVar22 = (layoutStruct->frameY).val;
            iVar23 = (layoutStruct->pageBottom).val;
            if (iVar23 < (int)(QVar27.val + uVar24 + iVar22)) {
              iVar8 = (layoutStruct->pageHeight).val;
              if (iVar8 != 0x1fffffc0) {
                (layoutStruct->pageBottom).val = iVar8 + iVar23;
                iVar23 = (iVar23 - iVar22) + (layoutStruct->pageBottomMargin).val +
                         (layoutStruct->pageTopMargin).val;
                iVar22 = (layoutStruct->y).val;
                if (iVar23 < iVar22) {
                  iVar23 = iVar22;
                }
                (layoutStruct->y).val = iVar23;
              }
              uVar38 = (ulong)(uint)(layoutStruct->y).val;
              pQVar35[1]._vptr_QTextFrameLayoutData = (_func_int **)((uVar38 << 0x20) + uVar40);
              *(undefined1 *)&pQVar35[0xb]._vptr_QTextFrameLayoutData = 1;
              QVar27.val = (layoutStruct->frameY).val;
              if (width.val == 0) {
                layoutFrame((QRectF *)local_58,this,(QTextFrame *)this_00,layoutFrom,layoutTo,QVar27
                           );
              }
              else {
                layoutFrame((QRectF *)local_58,this,(QTextFrame *)this_00,layoutFrom,layoutTo,width,
                            (QFixed)0xffffffc0,QVar27);
              }
            }
          }
          local_188._0_4_ = SUB84(qVar45,0);
          iVar22 = *(int *)&pQVar35[2]._vptr_QTextFrameLayoutData;
          if (iVar22 < local_d8._0_4_ - (int)local_188) {
            if ((uVar39 & 2) == 0) {
              if ((uVar39 & 4) != 0) {
                uVar40 = (ulong)(uint)(((layoutStruct->x_right).val - iVar22) / 2 + (int)local_188);
              }
            }
            else {
              uVar40 = (ulong)(uint)(((int)local_188 - iVar22) + (layoutStruct->x_right).val);
            }
          }
          local_188 = uVar40;
          pQVar35[1]._vptr_QTextFrameLayoutData = (_func_int **)(local_188 | uVar38 << 0x20);
          uVar24 = (layoutStruct->pageHeight).val;
          iVar22 = (layoutStruct->y).val +
                   *(int *)((long)&pQVar35[2]._vptr_QTextFrameLayoutData + 4);
          (layoutStruct->y).val = iVar22;
          if (uVar24 == 0) {
            iVar22 = 1;
          }
          else {
            uVar36 = iVar22 + (layoutStruct->frameY).val;
            uVar39 = -uVar36;
            if (0 < (int)uVar36) {
              uVar39 = uVar36;
            }
            uVar19 = -uVar24;
            if (0 < (int)uVar24) {
              uVar19 = uVar24;
            }
            iVar23 = (int)(((ulong)(uVar19 >> 1) + (ulong)uVar39 * 0x40) / (ulong)uVar19);
            iVar22 = -iVar23;
            if (-1 < (int)(uVar36 ^ uVar24)) {
              iVar22 = iVar23;
            }
            iVar22 = (iVar22 >> 6) + 1;
          }
          (layoutStruct->pageBottom).val = iVar22 * uVar24 - (layoutStruct->pageBottomMargin).val;
          *(undefined1 *)((long)&pQVar35[0xb]._vptr_QTextFrameLayoutData + 1) = 0;
          QTextFrame::frameFormat((QTextFrame *)local_58);
          uVar24 = QTextFormat::intProperty((QTextFormat *)local_58,0x7000);
          QTextFormat::~QTextFormat((QTextFormat *)local_58);
          if (((uVar24 & 0x10) != 0) &&
             (iVar22 = (layoutStruct->pageHeight).val, iVar22 != 0x1fffffc0)) {
            iVar23 = (layoutStruct->y).val;
            iVar8 = (layoutStruct->pageBottom).val;
            (layoutStruct->pageBottom).val = iVar22 + iVar8;
            iVar22 = (iVar8 + (layoutStruct->pageBottomMargin).val +
                     (layoutStruct->pageTopMargin).val) - (layoutStruct->frameY).val;
            if (iVar22 < iVar23) {
              iVar22 = iVar23;
            }
            (layoutStruct->y).val = iVar22;
          }
        }
        else {
          local_b8.xp = (double)(int)pQVar35[1]._vptr_QTextFrameLayoutData * 0.015625;
          local_b8.yp = (double)(int)((ulong)pQVar35[1]._vptr_QTextFrameLayoutData >> 0x20) *
                        0.015625;
          local_b8.w = (double)(int)pQVar35[2]._vptr_QTextFrameLayoutData * 0.015625;
          local_b8.h = (double)(int)((ulong)pQVar35[2]._vptr_QTextFrameLayoutData >> 0x20) *
                       0.015625;
          local_d8 = (undefined1  [8])0x0;
          dStack_d0 = 0.0;
          local_c8 = 0.0;
          dStack_c0 = 0.0;
          if (*(char *)&pQVar35[0xb]._vptr_QTextFrameLayoutData == '\x01') {
            layoutFrame((QRectF *)local_58,this,(QTextFrame *)this_00,layoutFrom,layoutTo,
                        (QFixed)0x0);
            local_d8 = (undefined1  [8])CONCAT44(QStack_54.val,local_58);
            dStack_d0 = (double)CONCAT44(QStack_4c.val,iStack_50);
            local_c8 = (double)CONCAT44(QStack_44.val,QStack_48.val);
            dStack_c0 = (double)CONCAT44(uStack_3c,iStack_40);
          }
          positionFloat(this,(QTextFrame *)this_00,(QTextLine *)0x0);
          if (*(char *)&pQVar35[0xb]._vptr_QTextFrameLayoutData == '\x01') {
            layoutFrame((QRectF *)local_58,this,(QTextFrame *)this_00,layoutFrom,layoutTo,
                        (QFixed)0x0);
            local_d8 = (undefined1  [8])CONCAT44(QStack_54.val,local_58);
            dStack_d0 = (double)CONCAT44(QStack_4c.val,iStack_50);
            local_c8 = (double)CONCAT44(QStack_44.val,QStack_48.val);
            dStack_c0 = (double)CONCAT44(uStack_3c,iStack_40);
          }
          local_f8.xp = (double)(int)pQVar35[1]._vptr_QTextFrameLayoutData * 0.015625;
          local_f8.yp = (double)(int)((ulong)pQVar35[1]._vptr_QTextFrameLayoutData >> 0x20) *
                        0.015625;
          local_f8.w = (double)(int)pQVar35[2]._vptr_QTextFrameLayoutData * 0.015625;
          local_f8.h = (double)(int)((ulong)pQVar35[2]._vptr_QTextFrameLayoutData >> 0x20) *
                       0.015625;
          bVar43 = comparesEqual(&local_f8,&local_b8);
          if (((!bVar43) || (local_c8 <= 0.0)) || (dStack_c0 <= 0.0)) {
            local_c8 = local_f8.w;
            dStack_c0 = local_f8.h;
            local_d8 = (undefined1  [8])local_f8.xp;
            dStack_d0 = local_f8.yp;
          }
          else {
            local_d8 = (undefined1  [8])
                       ((double)(int)pQVar35[1]._vptr_QTextFrameLayoutData * 0.015625 +
                       (double)local_d8);
            dStack_d0 = (double)(int)((ulong)pQVar35[1]._vptr_QTextFrameLayoutData >> 0x20) *
                        0.015625 + dStack_d0;
          }
          if (((layoutStruct->updateRectForFloats).w <= 0.0) ||
             ((layoutStruct->updateRectForFloats).h <= 0.0)) {
            (layoutStruct->updateRectForFloats).w = local_c8;
            (layoutStruct->updateRectForFloats).h = dStack_c0;
            pQVar1->xp = (qreal)local_d8;
            (layoutStruct->updateRectForFloats).yp = dStack_d0;
          }
          else {
            QRectF::operator|((QRectF *)local_58,pQVar1);
            (layoutStruct->updateRectForFloats).w = (qreal)CONCAT44(QStack_44.val,QStack_48.val);
            (layoutStruct->updateRectForFloats).h = (qreal)CONCAT44(uStack_3c,iStack_40);
            pQVar1->xp = (qreal)CONCAT44(QStack_54.val,local_58);
            (layoutStruct->updateRectForFloats).yp = (qreal)CONCAT44(QStack_4c.val,iStack_50);
          }
          if ((0.0 < local_b8.w) && (0.0 < local_b8.h)) {
            if (((layoutStruct->updateRectForFloats).w <= 0.0) ||
               ((layoutStruct->updateRectForFloats).h <= 0.0)) {
              (layoutStruct->updateRectForFloats).w = local_b8.w;
              (layoutStruct->updateRectForFloats).h = local_b8.h;
              pQVar1->xp = local_b8.xp;
              (layoutStruct->updateRectForFloats).yp = local_b8.yp;
            }
            else {
              QRectF::operator|((QRectF *)local_58,pQVar1);
              (layoutStruct->updateRectForFloats).w = (qreal)CONCAT44(QStack_44.val,QStack_48.val);
              (layoutStruct->updateRectForFloats).h = (qreal)CONCAT44(uStack_3c,iStack_40);
              pQVar1->xp = (qreal)CONCAT44(QStack_54.val,local_58);
              (layoutStruct->updateRectForFloats).yp = (qreal)CONCAT44(QStack_4c.val,iStack_50);
            }
          }
        }
        iVar22 = *(int *)((long)&pQVar35[8]._vptr_QTextFrameLayoutData + 4);
        iVar23 = (layoutStruct->minimumWidth).val;
        iVar8 = (layoutStruct->maximumWidth).val;
        if (iVar22 < iVar23) {
          iVar22 = iVar23;
        }
        (layoutStruct->minimumWidth).val = iVar22;
        iVar22 = *(int *)&pQVar35[9]._vptr_QTextFrameLayoutData;
        if (iVar8 < *(int *)&pQVar35[9]._vptr_QTextFrameLayoutData) {
          iVar22 = iVar8;
        }
        (layoutStruct->maximumWidth).val = iVar22;
        local_78.cf._0_4_ = (int)it.cf;
        local_78.cf._4_4_ = it.cf._4_4_;
        local_78.cb = it.cb;
        local_78.f = it.f;
        local_78.b = it.b;
        local_78.e = it.e;
        QTextFrame::iterator::operator++(&it);
        QTextFormat::~QTextFormat((QTextFormat *)local_98);
      }
      this_00 = (QTextDocumentLayoutPrivate *)CONCAT44(it.cf._4_4_,(int)it.cf);
      bVar43 = this_00 == (QTextDocumentLayoutPrivate *)0x0;
    } while ((!bVar43) || (it.cb != it.e));
  }
  iVar22 = (layoutStruct->maximumWidth).val;
  iVar23 = local_194;
  if (local_194 < iVar22) {
    iVar23 = iVar22;
  }
  if (local_194 < 1) {
    local_194 = iVar23;
  }
  if (iVar22 != 0x1fffffc0) {
    local_194 = iVar23;
  }
  (layoutStruct->maximumWidth).val = local_194;
  lVar28 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
  if (lVar28 == 0) {
    QStack_48.val = -0x55555556;
    QStack_44.val = -0x55555556;
    local_58 = (undefined1  [4])0xaaaaaaaa;
    QStack_54.val = -0x55555556;
    iStack_50 = -0x55555556;
    QStack_4c.val = -0x55555556;
    QTextFrame::childFrames((QList<QTextFrame_*> *)local_58,layoutStruct->frame);
    if (CONCAT44(QStack_44.val,QStack_48.val) != 0) {
      uVar40 = 0;
      do {
        pQVar34 = *(QTextFrame **)(CONCAT44(QStack_4c.val,iStack_50) + uVar40 * 8);
        pQVar35 = QTextFrame::layoutData(pQVar34);
        if (pQVar35 == (QTextFrameLayoutData *)0x0) {
          lVar28 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
          if (lVar28 == 0) {
            pQVar35 = (QTextFrameLayoutData *)operator_new(0x78);
            pQVar35->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007edfd0;
            *(undefined1 (*) [16])(pQVar35 + 1) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar35 + 3) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar35 + 5) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar35 + 7) = (undefined1  [16])0x0;
            *(undefined4 *)&pQVar35[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
            pQVar35[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined2 *)&pQVar35[0xb]._vptr_QTextFrameLayoutData = 0x101;
            *(undefined1 (*) [16])(pQVar35 + 0xc) = (undefined1  [16])0x0;
            pQVar35[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          }
          else {
            pQVar35 = (QTextFrameLayoutData *)operator_new(0x160);
            *(undefined1 (*) [16])(pQVar35 + 1) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar35 + 3) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar35 + 5) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar35 + 7) = (undefined1  [16])0x0;
            *(undefined4 *)&pQVar35[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
            pQVar35[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined2 *)&pQVar35[0xb]._vptr_QTextFrameLayoutData = 0x101;
            *(undefined1 (*) [16])(pQVar35 + 0xc) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar35 + 0xe) = (undefined1  [16])0x0;
            pQVar35->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007ee180;
            *(undefined1 (*) [16])(pQVar35 + 0x2a) = (undefined1  [16])0x0;
            memset(pQVar35 + 0x11,0,0xc0);
          }
          QTextFrame::setLayoutData(pQVar34,pQVar35);
        }
        if (*(char *)((long)&pQVar35[0xb]._vptr_QTextFrameLayoutData + 1) == '\0') {
          QTextFrame::frameFormat((QTextFrame *)&local_b8);
          iVar22 = QTextFormat::intProperty((QTextFormat *)&local_b8,0x800);
          bVar43 = iVar22 != 0;
          QTextFormat::~QTextFormat((QTextFormat *)&local_b8);
        }
        else {
          bVar43 = false;
        }
        if (bVar43) {
          iVar23 = *(int *)((long)&pQVar35[1]._vptr_QTextFrameLayoutData + 4) +
                   *(int *)((long)&pQVar35[2]._vptr_QTextFrameLayoutData + 4);
          iVar22 = (layoutStruct->y).val;
          if (iVar23 < iVar22) {
            iVar23 = iVar22;
          }
          (layoutStruct->y).val = iVar23;
        }
        uVar40 = uVar40 + 1;
      } while (uVar40 < CONCAT44(QStack_44.val,QStack_48.val));
    }
    piVar20 = (int *)CONCAT44(QStack_54.val,local_58);
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(QStack_54.val,local_58),8,0x10);
      }
    }
  }
  if (pQVar15 == pQVar29) {
    if (data[0xe]._vptr_QTextFrameLayoutData != (_func_int **)0x0) {
      this->contentHasAlignment = true;
    }
    if (((CONCAT44(it.cf._4_4_,(int)it.cf) == 0) && (it.cb == it.e)) ||
       (0x1fffffbf < (layoutStruct->frameY).val + (layoutStruct->y).val)) {
      this->currentLazyLayoutPosition = -1;
      iStack_50 = -0x55555556;
      QStack_54.val = 0;
      QStack_4c.val = 0;
      QStack_48.val = 0;
      QStack_44.val = 0;
      local_58 = (undefined1  [4])(layoutStruct->y).val;
      iStack_50 = QFragmentMapData<QTextFragmentData>::length
                            (&(((this->super_QAbstractTextDocumentLayoutPrivate).docPrivate)->
                              fragments).data,0);
      uVar14 = layoutStruct->minimumWidth;
      uVar18 = layoutStruct->maximumWidth;
      QStack_44.val = (layoutStruct->contentsWidth).val;
      pQVar2 = &this->checkPoints;
      QStack_4c.val = uVar14;
      QStack_48.val = uVar18;
      QtPrivate::QPodArrayOps<QCheckPoint>::emplace<QCheckPoint_const&>
                ((QPodArrayOps<QCheckPoint> *)pQVar2,(this->checkPoints).d.size,
                 (QCheckPoint *)local_58);
      QList<QCheckPoint>::end(pQVar2);
      QList<QCheckPoint>::reserve(pQVar2,(this->checkPoints).d.size);
    }
    else {
      this->currentLazyLayoutPosition =
           (this->checkPoints).d.ptr[(this->checkPoints).d.size + -1].positionInFrame;
    }
  }
  data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
  QTextFormat::~QTextFormat((QTextFormat *)local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::layoutFlow(QTextFrame::Iterator it, QTextLayoutStruct *layoutStruct,
                                            int layoutFrom, int layoutTo, QFixed width)
{
    qCDebug(lcLayout) << "layoutFlow from=" << layoutFrom << "to=" << layoutTo;
    QTextFrameData *fd = data(layoutStruct->frame);

    fd->currentLayoutStruct = layoutStruct;

    QTextFrame::Iterator previousIt;

    const bool inRootFrame = (it.parentFrame() == document->rootFrame());
    if (inRootFrame) {
        bool redoCheckPoints = layoutStruct->fullLayout || checkPoints.isEmpty();

        if (!redoCheckPoints) {
            auto checkPoint = std::lower_bound(checkPoints.begin(), checkPoints.end(), layoutFrom);
            if (checkPoint != checkPoints.end()) {
                if (checkPoint != checkPoints.begin())
                    --checkPoint;

                layoutStruct->y = checkPoint->y;
                layoutStruct->frameY = checkPoint->frameY;
                layoutStruct->minimumWidth = checkPoint->minimumWidth;
                layoutStruct->maximumWidth = checkPoint->maximumWidth;
                layoutStruct->contentsWidth = checkPoint->contentsWidth;

                if (layoutStruct->pageHeight > 0) {
                    int page = layoutStruct->currentPage();
                    layoutStruct->pageBottom = (page + 1) * layoutStruct->pageHeight - layoutStruct->pageBottomMargin;
                }

                it = frameIteratorForTextPosition(checkPoint->positionInFrame);
                checkPoints.resize(checkPoint - checkPoints.begin() + 1);

                if (checkPoint != checkPoints.begin()) {
                    previousIt = it;
                    --previousIt;
                }
            } else {
                redoCheckPoints = true;
            }
        }

        if (redoCheckPoints) {
            checkPoints.clear();
            QCheckPoint cp;
            cp.y = layoutStruct->y;
            cp.frameY = layoutStruct->frameY;
            cp.positionInFrame = 0;
            cp.minimumWidth = layoutStruct->minimumWidth;
            cp.maximumWidth = layoutStruct->maximumWidth;
            cp.contentsWidth = layoutStruct->contentsWidth;
            checkPoints.append(cp);
        }
    }

    QTextBlockFormat previousBlockFormat = previousIt.currentBlock().blockFormat();

    QFixed maximumBlockWidth = 0;
    while (!it.atEnd() && layoutStruct->absoluteY() < QFIXED_MAX) {
        QTextFrame *c = it.currentFrame();

        int docPos;
        if (it.currentFrame())
            docPos = it.currentFrame()->firstPosition();
        else
            docPos = it.currentBlock().position();

        if (inRootFrame) {
            if (qAbs(layoutStruct->y - checkPoints.constLast().y) > 2000) {
                QFixed left, right;
                floatMargins(layoutStruct->y, layoutStruct, &left, &right);
                if (left == layoutStruct->x_left && right == layoutStruct->x_right) {
                    QCheckPoint p;
                    p.y = layoutStruct->y;
                    p.frameY = layoutStruct->frameY;
                    p.positionInFrame = docPos;
                    p.minimumWidth = layoutStruct->minimumWidth;
                    p.maximumWidth = layoutStruct->maximumWidth;
                    p.contentsWidth = layoutStruct->contentsWidth;
                    checkPoints.append(p);

                    if (currentLazyLayoutPosition != -1
                        && docPos > currentLazyLayoutPosition + lazyLayoutStepSize)
                        break;

                }
            }
        }

        if (c) {
            // position child frame
            QTextFrameData *cd = data(c);

            QTextFrameFormat fformat = c->frameFormat();

            if (fformat.position() == QTextFrameFormat::InFlow) {
                if (fformat.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysBefore)
                    layoutStruct->newPage();

                QFixed left, right;
                floatMargins(layoutStruct->y, layoutStruct, &left, &right);
                left = qMax(left, layoutStruct->x_left);
                right = qMin(right, layoutStruct->x_right);

                if (right - left < cd->size.width) {
                    layoutStruct->y = findY(layoutStruct->y, layoutStruct, cd->size.width);
                    floatMargins(layoutStruct->y, layoutStruct, &left, &right);
                }

                QFixedPoint pos(left, layoutStruct->y);

                Qt::Alignment align = Qt::AlignLeft;

                QTextTable *table = qobject_cast<QTextTable *>(c);

                if (table)
                    align = table->format().alignment() & Qt::AlignHorizontal_Mask;

                // detect whether we have any alignment in the document that disallows optimizations,
                // such as not laying out the document again in a textedit with wrapping disabled.
                if (inRootFrame && !(align & Qt::AlignLeft))
                    contentHasAlignment = true;

                cd->position = pos;

                if (document->pageSize().height() > 0.0f)
                    cd->sizeDirty = true;

                if (cd->sizeDirty) {
                    if (width != 0)
                        layoutFrame(c, layoutFrom, layoutTo, width, -1, layoutStruct->frameY);
                    else
                        layoutFrame(c, layoutFrom, layoutTo, layoutStruct->frameY);

                    QFixed absoluteChildPos = table ? pos.y + static_cast<QTextTableData *>(data(table))->rowPositions.at(0) : pos.y + firstChildPos(c);
                    absoluteChildPos += layoutStruct->frameY;

                    // drop entire frame to next page if first child of frame is on next page
                    if (absoluteChildPos > layoutStruct->pageBottom) {
                        layoutStruct->newPage();
                        pos.y = layoutStruct->y;

                        cd->position = pos;
                        cd->sizeDirty = true;

                        if (width != 0)
                            layoutFrame(c, layoutFrom, layoutTo, width, -1, layoutStruct->frameY);
                        else
                            layoutFrame(c, layoutFrom, layoutTo, layoutStruct->frameY);
                    }
                }

                // align only if there is space for alignment
                if (right - left > cd->size.width) {
                    if (align & Qt::AlignRight)
                        pos.x += layoutStruct->x_right - cd->size.width;
                    else if (align & Qt::AlignHCenter)
                        pos.x += (layoutStruct->x_right - cd->size.width) / 2;
                }

                cd->position = pos;

                layoutStruct->y += cd->size.height;
                const int page = layoutStruct->currentPage();
                layoutStruct->pageBottom = (page + 1) * layoutStruct->pageHeight - layoutStruct->pageBottomMargin;

                cd->layoutDirty = false;

                if (c->frameFormat().pageBreakPolicy() & QTextFormat::PageBreak_AlwaysAfter)
                    layoutStruct->newPage();
            } else {
                QRectF oldFrameRect(cd->position.toPointF(), cd->size.toSizeF());
                QRectF updateRect;

                if (cd->sizeDirty)
                    updateRect = layoutFrame(c, layoutFrom, layoutTo);

                positionFloat(c);

                // If the size was made dirty when the position was set, layout again
                if (cd->sizeDirty)
                    updateRect = layoutFrame(c, layoutFrom, layoutTo);

                QRectF frameRect(cd->position.toPointF(), cd->size.toSizeF());

                if (frameRect == oldFrameRect && updateRect.isValid())
                    updateRect.translate(cd->position.toPointF());
                else
                    updateRect = frameRect;

                layoutStruct->addUpdateRectForFloat(updateRect);
                if (oldFrameRect.isValid())
                    layoutStruct->addUpdateRectForFloat(oldFrameRect);
            }

            layoutStruct->minimumWidth = qMax(layoutStruct->minimumWidth, cd->minimumWidth);
            layoutStruct->maximumWidth = qMin(layoutStruct->maximumWidth, cd->maximumWidth);

            previousIt = it;
            ++it;
        } else {
            QTextFrame::Iterator lastIt;
            if (!previousIt.atEnd() && previousIt != it)
                lastIt = previousIt;
            previousIt = it;
            QTextBlock block = it.currentBlock();
            ++it;

            const QTextBlockFormat blockFormat = block.blockFormat();

            if (blockFormat.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysBefore)
                layoutStruct->newPage();

            const QFixed origY = layoutStruct->y;
            const QFixed origPageBottom = layoutStruct->pageBottom;
            const QFixed origMaximumWidth = layoutStruct->maximumWidth;
            layoutStruct->maximumWidth = 0;

            const QTextBlockFormat *previousBlockFormatPtr = nullptr;
            if (lastIt.currentBlock().isValid())
                previousBlockFormatPtr = &previousBlockFormat;

            // layout and position child block
            layoutBlock(block, docPos, blockFormat, layoutStruct, layoutFrom, layoutTo, previousBlockFormatPtr);

            // detect whether we have any alignment in the document that disallows optimizations,
            // such as not laying out the document again in a textedit with wrapping disabled.
            if (inRootFrame && !(block.layout()->textOption().alignment() & Qt::AlignLeft))
                contentHasAlignment = true;

            // if the block right before a table is empty 'hide' it by
            // positioning it into the table border
            if (isEmptyBlockBeforeTable(block, blockFormat, it)) {
                const QTextBlock lastBlock = lastIt.currentBlock();
                const qreal lastBlockBottomMargin = lastBlock.isValid() ? lastBlock.blockFormat().bottomMargin() : 0.0f;
                layoutStruct->y = origY + QFixed::fromReal(qMax(lastBlockBottomMargin, block.blockFormat().topMargin()));
                layoutStruct->pageBottom = origPageBottom;
            } else {
                // if the block right after a table is empty then 'hide' it, too
                if (isEmptyBlockAfterTable(block, lastIt.currentFrame())) {
                    QTextTableData *td = static_cast<QTextTableData *>(data(lastIt.currentFrame()));
                    QTextLayout *layout = block.layout();

                    QPointF pos((td->position.x + td->size.width).toReal(),
                                (td->position.y + td->size.height).toReal() - layout->boundingRect().height());

                    layout->setPosition(pos);
                    layoutStruct->y = origY;
                    layoutStruct->pageBottom = origPageBottom;
                }

                // if the block right after a table starts with a line separator, shift it up by one line
                if (isLineSeparatorBlockAfterTable(block, lastIt.currentFrame())) {
                    QTextTableData *td = static_cast<QTextTableData *>(data(lastIt.currentFrame()));
                    QTextLayout *layout = block.layout();

                    QFixed height = layout->lineCount() > 0 ? QFixed::fromReal(layout->lineAt(0).height()) : QFixed();

                    if (layoutStruct->pageBottom == origPageBottom) {
                        layoutStruct->y -= height;
                        layout->setPosition(layout->position() - QPointF(0, height.toReal()));
                    } else {
                        // relayout block to correctly handle page breaks
                        layoutStruct->y = origY - height;
                        layoutStruct->pageBottom = origPageBottom;
                        layoutBlock(block, docPos, blockFormat, layoutStruct, layoutFrom, layoutTo, previousBlockFormatPtr);
                    }

                    if (layout->lineCount() > 0) {
                        QPointF linePos((td->position.x + td->size.width).toReal(),
                                        (td->position.y + td->size.height - height).toReal());

                        layout->lineAt(0).setPosition(linePos - layout->position());
                    }
                }

                if (blockFormat.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysAfter)
                    layoutStruct->newPage();
            }

            maximumBlockWidth = qMax(maximumBlockWidth, layoutStruct->maximumWidth);
            layoutStruct->maximumWidth = origMaximumWidth;
            previousBlockFormat = blockFormat;
        }
    }
    if (layoutStruct->maximumWidth == QFIXED_MAX && maximumBlockWidth > 0)
        layoutStruct->maximumWidth = maximumBlockWidth;
    else
        layoutStruct->maximumWidth = qMax(layoutStruct->maximumWidth, maximumBlockWidth);

    // a float at the bottom of a frame may make it taller, hence the qMax() for layoutStruct->y.
    // we don't need to do it for tables though because floats in tables are per table
    // and not per cell and layoutCell already takes care of doing the same as we do here
    if (!qobject_cast<QTextTable *>(layoutStruct->frame)) {
        QList<QTextFrame *> children = layoutStruct->frame->childFrames();
        for (int i = 0; i < children.size(); ++i) {
            QTextFrameData *fd = data(children.at(i));
            if (!fd->layoutDirty && children.at(i)->frameFormat().position() != QTextFrameFormat::InFlow)
                layoutStruct->y = qMax(layoutStruct->y, fd->position.y + fd->size.height);
        }
    }

    if (inRootFrame) {
        // we assume that any float is aligned in a way that disallows the optimizations that rely
        // on unaligned content.
        if (!fd->floats.isEmpty())
            contentHasAlignment = true;

        if (it.atEnd() || layoutStruct->absoluteY() >= QFIXED_MAX) {
            //qDebug("layout done!");
            currentLazyLayoutPosition = -1;
            QCheckPoint cp;
            cp.y = layoutStruct->y;
            cp.positionInFrame = docPrivate->length();
            cp.minimumWidth = layoutStruct->minimumWidth;
            cp.maximumWidth = layoutStruct->maximumWidth;
            cp.contentsWidth = layoutStruct->contentsWidth;
            checkPoints.append(cp);
            checkPoints.reserve(checkPoints.size());
        } else {
            currentLazyLayoutPosition = checkPoints.constLast().positionInFrame;
            // #######
            //checkPoints.last().positionInFrame = QTextDocumentPrivate::get(q->document())->length();
        }
    }


    fd->currentLayoutStruct = nullptr;
}